

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O2

void write_audio_frame(Emulator *e,u32 gb_frames)

{
  u32 *puVar1;
  byte bVar2;
  u8 *puVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  Emulator *pEVar11;
  
  puVar1 = &(e->audio_buffer).divisor;
  *puVar1 = *puVar1 + gb_frames;
  uVar8 = gb_frames * (e->audio_buffer).frequency + (e->audio_buffer).freq_counter;
  uVar4 = uVar8 - 0x200000;
  if (0x1fffff >= uVar8) {
    uVar4 = uVar8;
  }
  (e->audio_buffer).freq_counter = uVar4;
  if (0x1fffff < uVar8) {
    lVar6 = 0x33684;
    for (lVar9 = 0; lVar9 != 2; lVar9 = lVar9 + 1) {
      iVar7 = 0;
      lVar10 = lVar6;
      pEVar11 = e;
      for (lVar5 = 0xcdd4; lVar5 != 0xce14; lVar5 = lVar5 + 0x10) {
        if ((pEVar11->config).disable_sound[0] == FALSE) {
          iVar7 = iVar7 + *(int *)((long)(e->config).disable_sound + lVar10) *
                          (e->config).disable_sound[lVar5];
        }
        pEVar11 = (Emulator *)((pEVar11->config).disable_sound + 1);
        lVar10 = lVar10 + 8;
      }
      bVar2 = (e->state).apu.so_volume[lVar9];
      puVar3 = (e->audio_buffer).position;
      (e->audio_buffer).position = puVar3 + 1;
      *puVar3 = (u8)((((uint)bVar2 * 0x10 + 0x10) * iVar7 >> 5) / (e->audio_buffer).divisor);
      lVar6 = lVar6 + 4;
    }
    for (lVar6 = 0; lVar6 != 0x100; lVar6 = lVar6 + 0x40) {
      *(undefined4 *)((long)&(e->state).apu.channel[0].accumulator + lVar6) = 0;
    }
    (e->audio_buffer).divisor = 0;
  }
  if ((e->audio_buffer).position <= (e->audio_buffer).end) {
    return;
  }
  __assert_fail("buffer->position <= buffer->end",
                "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/emulator.c",
                0xf36,"void write_audio_frame(Emulator *, u32)");
}

Assistant:

static void write_audio_frame(Emulator* e, u32 gb_frames) {
  int i, j;
  AudioBuffer* buffer = &e->audio_buffer;
  buffer->divisor += gb_frames;
  buffer->freq_counter += buffer->frequency * gb_frames;
  if (VALUE_WRAPPED(buffer->freq_counter, APU_TICKS_PER_SECOND)) {
    for (i = 0; i < SOUND_OUTPUT_COUNT; ++i) {
      u32 accumulator = 0;
      for (j = 0; j < APU_CHANNEL_COUNT; ++j) {
        if (!e->config.disable_sound[j]) {
          accumulator += APU.channel[j].accumulator * APU.so_output[j][i];
        }
      }
      accumulator *= (APU.so_volume[i] + 1) * 16; /* 4bit -> 8bit samples. */
      accumulator /= ((SOUND_OUTPUT_MAX_VOLUME + 1) * APU_CHANNEL_COUNT);
      *buffer->position++ = accumulator / buffer->divisor;
    }
    for (j = 0; j < APU_CHANNEL_COUNT; ++j) {
      APU.channel[j].accumulator = 0;
    }
    buffer->divisor = 0;
  }
  assert(buffer->position <= buffer->end);
}